

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_25::CppCodeGenerator::GenerateMakeRule
          (CppCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  _Base_ptr p_Var1;
  string make_rule;
  string filebase;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  CppGenerator geneartor;
  string local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  string local_a00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9e0;
  IDLOptionsCpp local_9b0;
  CppGenerator local_698;
  
  StripExtension((string *)&local_698,filename);
  StripPath(&local_a00,(string *)&local_698);
  std::__cxx11::string::~string((string *)&local_698);
  cpp::IDLOptionsCpp::IDLOptionsCpp(&local_9b0,&parser->opts);
  cpp::CppGenerator::CppGenerator(&local_698,parser,path,filename,&local_9b0);
  IDLOptions::~IDLOptions(&local_9b0.super_IDLOptions);
  Parser::GetIncludedFilesRecursive
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_9e0,parser,filename);
  BaseGenerator::GeneratedFileName
            (&local_a40,&local_698.super_BaseGenerator,path,&local_a00,&parser->opts);
  std::operator+(&local_a20,&local_a40,": ");
  std::__cxx11::string::~string((string *)&local_a40);
  for (p_Var1 = local_9e0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &local_9e0._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::operator+(&local_a40," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    std::__cxx11::string::append((string *)&local_a20);
    std::__cxx11::string::~string((string *)&local_a40);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_9e0);
  cpp::CppGenerator::~CppGenerator(&local_698);
  std::__cxx11::string::~string((string *)&local_a00);
  std::__cxx11::string::operator=((string *)output,(string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_a20);
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = CPPMakeRule(parser, path, filename);
    return Status::OK;
  }